

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_reallocstack(lua_State *L,int newsize)

{
  StkId block;
  UpVal *pUVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  StkId pTVar5;
  CallInfo *pCVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  block = L->stack;
  iVar13 = L->stacksize;
  lVar8 = (long)iVar13;
  lVar10 = (long)newsize;
  pTVar5 = (StkId)luaM_realloc_(L,block,lVar8 * 0x10,lVar10 * 0x10);
  L->stack = pTVar5;
  auVar4 = _DAT_00121020;
  auVar3 = _DAT_00121010;
  auVar2 = _DAT_00121000;
  if (iVar13 < newsize) {
    lVar11 = (lVar10 - lVar8) + -1;
    auVar12._8_4_ = (int)lVar11;
    auVar12._0_8_ = lVar11;
    auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
    piVar7 = &pTVar5[lVar8 + 3].tt_;
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_00121020;
    do {
      auVar14._8_4_ = (int)uVar9;
      auVar14._0_8_ = uVar9;
      auVar14._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar14 | auVar3) ^ auVar4;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        piVar7[-0xc] = 0;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        piVar7[-8] = 0;
      }
      auVar14 = (auVar14 | auVar2) ^ auVar4;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        piVar7[-4] = 0;
        *piVar7 = 0;
      }
      uVar9 = uVar9 + 4;
      piVar7 = piVar7 + 0x10;
    } while (((lVar10 - lVar8) + 3U & 0xfffffffffffffffc) != uVar9);
  }
  L->stacksize = newsize;
  L->stack_last = pTVar5 + lVar10 + -5;
  L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar5);
  pUVar1 = L->openupval;
  while (pUVar1 != (UpVal *)0x0) {
    pUVar1->v = (TValue *)(((long)pUVar1->v - (long)block) + (long)pTVar5);
    pUVar1 = (pUVar1->u).open.next;
  }
  for (pCVar6 = L->ci; pCVar6 != (CallInfo *)0x0; pCVar6 = pCVar6->previous) {
    pTVar5 = L->stack;
    pCVar6->top = (StkId)(((long)pCVar6->top - (long)block) + (long)pTVar5);
    pCVar6->func = (StkId)(((long)pCVar6->func - (long)block) + (long)pTVar5);
    if ((pCVar6->callstatus & 2) != 0) {
      (pCVar6->u).l.base = (StkId)((long)pTVar5 + ((long)(pCVar6->u).l.base - (long)block));
    }
  }
  return;
}

Assistant:

void luaD_reallocstack (lua_State *L, int newsize) {
  TValue *oldstack = L->stack;
  int lim = L->stacksize;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  lua_assert(L->stack_last - L->stack == L->stacksize - EXTRA_STACK);
  luaM_reallocvector(L, L->stack, L->stacksize, newsize, TValue);
  for (; lim < newsize; lim++)
    setnilvalue(L->stack + lim); /* erase new segment */
  L->stacksize = newsize;
  L->stack_last = L->stack + newsize - EXTRA_STACK;
  correctstack(L, oldstack);
}